

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  service srv;
  service asStack_48 [8];
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  cppcms::service::service(asStack_48,argc,argv);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar1,local_40,0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  local_28 = 0;
  local_18 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_20 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_30 = asStack_48;
  cppcms::service::after_fork((function *)asStack_48);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  cppcms::service::run();
  cppcms::service::~service(asStack_48);
  return run_ok ^ 1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}